

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

void botpDT(char *otp,size_t digit,octet *mac,size_t mac_len)

{
  ulong uVar1;
  
  uVar1 = (ulong)(mac[mac_len - 1] & 0xf);
  decFromU32(otp,digit,
             (((uint)mac[uVar1 + 2] | (uint)mac[uVar1 + 1] << 8 | (mac[uVar1] & 0x7f) << 0x10) << 8
             | (uint)mac[uVar1 + 3]) % powers_of_10[digit]);
  return;
}

Assistant:

void botpDT(char* otp, size_t digit, const octet mac[], size_t mac_len)
{
	register u32 pwd;
	register size_t offset;
	ASSERT(mac_len >= 20);
	ASSERT(4 <= digit && digit <= 9);
	ASSERT(memIsValid(otp, digit + 1));
	ASSERT(memIsValid(mac, mac_len));
	offset = mac[mac_len - 1] & 15;
	pwd = mac[offset], pwd <<= 8;
	pwd ^= mac[offset + 1], pwd <<= 8;
	pwd ^= mac[offset + 2], pwd <<= 8;
	pwd ^= mac[offset + 3];
	pwd &= 0x7FFFFFFF;
	pwd %= powers_of_10[digit];
	decFromU32(otp, digit, pwd);
	offset = 0;
	pwd = 0;
}